

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>::
index_key_value<jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
           *this,key_type *Name,int64_t Index,byte_string_arg_t *args,byte_string_view *args_1,
          semantic_tag *args_2)

{
  index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
  iVar1;
  pointer phVar2;
  allocator<wchar_t> local_29;
  
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)Name);
  *(int64_t *)(this + 0x20) = Index;
  iVar1 = (index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
           )*args_2;
  phVar2 = utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<wchar_t>_>::
           create(args_1->data_,args_1->size_,0,&local_29);
  this[0x28] = (index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
                )0xc;
  this[0x29] = iVar1;
  *(pointer *)(this + 0x30) = phVar2;
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }